

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O0

void ParseOldDecoration(FScanner *sc,EDefinitionType def)

{
  BYTE *pBVar1;
  undefined1 auVar2 [16];
  PClass *this;
  uint uVar3;
  PClassActor *pPVar4;
  char *pcVar5;
  FState *pFVar6;
  ulong uVar7;
  FState *__src;
  PClassActor *local_150;
  Self local_148;
  FName local_144;
  ulong local_140;
  size_t i;
  FState icecopy;
  FName local_104;
  FName local_100;
  FName local_fc;
  PClassActor *pPStack_f8;
  FName typeName;
  PClassActor *parent;
  PClassActor *type;
  FExtraInfo extra;
  undefined1 local_98 [8];
  TArray<FState,_FState> StateArray;
  Baggage bag;
  EDefinitionType def_local;
  FScanner *sc_local;
  
  bag.ScriptPosition._12_4_ = def;
  Baggage::Baggage((Baggage *)&StateArray.Most);
  TArray<FState,_FState>::TArray((TArray<FState,_FState> *)local_98);
  FName::FName(&local_fc);
  if (bag.ScriptPosition._12_4_ == 2) {
    local_150 = (PClassActor *)AFakeInventory::RegistrationInfo.MyClass;
  }
  else {
    local_150 = (PClassActor *)AActor::RegistrationInfo.MyClass;
  }
  pPStack_f8 = local_150;
  FScanner::MustGetString(sc);
  FName::FName(&local_100,sc->String);
  FName::operator=(&local_fc,&local_100);
  pPVar4 = pPStack_f8;
  FName::FName(&local_104,&local_fc);
  pPVar4 = (PClassActor *)
           PClass::CreateDerivedClass
                     (&pPVar4->super_PClass,&local_104,
                      *(uint *)&(pPStack_f8->super_PClass).super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.super_DObject.field_0x24);
  ResetBaggage((Baggage *)&StateArray.Most,pPStack_f8);
  bag.ClassName.Chars = (char *)pPVar4;
  pcVar5 = FName::operator_cast_to_char_
                     (&(pPVar4->super_PClass).super_PStruct.super_PNamedType.TypeName);
  FString::operator=((FString *)&StateArray.Most,pcVar5);
  pPVar4->GameFilter = '\0';
  FScanner::MustGetStringName(sc,"{");
  extra.bSolidOnDeath = false;
  extra.bSolidOnBurn = false;
  extra.bBurnAway = false;
  extra.bDiesAway = false;
  extra.bGenericIceDeath = false;
  extra.bExplosive = false;
  extra._46_2_ = 0;
  extra.DeathHeight = 0.0;
  extra.IceDeathStart = 0;
  extra.IceDeathEnd = 0;
  extra.FireDeathStart = 0;
  extra.FireDeathEnd = 0;
  extra.SpawnStart = 0;
  extra.SpawnEnd = 0;
  extra.DeathStart = 0;
  extra.DeathEnd = 0;
  type = (PClassActor *)0x0;
  extra.DeathSprite[0] = '\0';
  extra.DeathSprite[1] = '\0';
  extra.DeathSprite[2] = '\0';
  extra.DeathSprite[3] = '\0';
  extra.DeathSprite[4] = '\0';
  extra._5_3_ = 0;
  ParseInsideDecoration
            ((Baggage *)&StateArray.Most,(AActor *)(pPVar4->super_PClass).Defaults,
             (FExtraInfo *)&type,bag.ScriptPosition._12_4_,sc,(TArray<FState,_FState> *)local_98);
  uVar3 = TArray<FState,_FState>::Size((TArray<FState,_FState> *)local_98);
  *(uint *)(bag.ClassName.Chars + 0xf8) = uVar3;
  if (*(int *)(bag.ClassName.Chars + 0xf8) == 0) {
    pcVar5 = FName::GetChars(&local_fc);
    FScanner::ScriptError(sc,"%s does not define any animation frames",pcVar5);
  }
  else if (extra._4_4_ == 0) {
    pcVar5 = FName::GetChars(&local_fc);
    FScanner::ScriptError(sc,"%s does not have a Frames definition",pcVar5);
  }
  else if ((bag.ScriptPosition._12_4_ == 1) && (extra.SpawnEnd == 0)) {
    pcVar5 = FName::GetChars(&local_fc);
    FScanner::ScriptError(sc,"%s does not have a DeathFrames definition",pcVar5);
  }
  else if ((extra.DeathEnd != 0) && ((extra._32_8_ & 0x100000000) != 0)) {
    FScanner::ScriptError(sc,"You cannot use IceDeathFrames and GenericIceDeath together");
  }
  if (extra.DeathEnd != 0) {
    pFVar6 = TArray<FState,_FState>::operator[]
                       ((TArray<FState,_FState> *)local_98,(ulong)(extra.DeathEnd - 1));
    icecopy._24_8_ = *(undefined8 *)&pFVar6->Light;
    i = (size_t)pFVar6->NextState;
    icecopy.NextState = (FState *)pFVar6->ActionFunc;
    icecopy.ActionFunc = *(VMFunction **)&pFVar6->sprite;
    icecopy._16_8_ = *(undefined8 *)&pFVar6->Misc1;
    TArray<FState,_FState>::Push((TArray<FState,_FState> *)local_98,(FState *)&i);
    pPVar4->NumOwnedStates = pPVar4->NumOwnedStates + 1;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)pPVar4->NumOwnedStates;
  uVar7 = SUB168(auVar2 * ZEXT816(0x28),0);
  if (SUB168(auVar2 * ZEXT816(0x28),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pFVar6 = (FState *)operator_new__(uVar7);
  pPVar4->OwnedStates = pFVar6;
  pFVar6 = pPVar4->OwnedStates;
  __src = TArray<FState,_FState>::operator[]((TArray<FState,_FState> *)local_98,0);
  memcpy(pFVar6,__src,(long)pPVar4->NumOwnedStates * 0x28);
  if (pPVar4->NumOwnedStates == 1) {
    pPVar4->OwnedStates->Tics = -1;
    pPVar4->OwnedStates->TicRange = 0;
    pPVar4->OwnedStates->Misc1 = 0;
  }
  else {
    for (local_140 = extra._0_8_ & 0xffffffff; local_140 < extra._4_4_ - 1;
        local_140 = local_140 + 1) {
      pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + local_140 + 1;
    }
    pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + (extra._0_8_ & 0xffffffff);
    if (extra.SpawnEnd != 0) {
      for (local_140 = extra._8_8_ & 0xffffffff; local_140 < extra.SpawnEnd - 1;
          local_140 = local_140 + 1) {
        pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + local_140 + 1;
      }
      if (((extra._32_8_ & 0x1000000) == 0) && (bag.ScriptPosition._12_4_ != 3)) {
        pPVar4->OwnedStates[local_140].Tics = -1;
        pPVar4->OwnedStates[local_140].TicRange = 0;
        pPVar4->OwnedStates[local_140].Misc1 = 0;
      }
      else {
        pPVar4->OwnedStates[local_140].NextState = (FState *)0x0;
      }
      if (bag.ScriptPosition._12_4_ == 3) {
        if ((extra._32_8_ & 0x10000000000) != 0) {
          FState::SetAction(pPVar4->OwnedStates + (extra._8_8_ & 0xffffffff),"A_Explode");
        }
      }
      else {
        FState::SetAction(pPVar4->OwnedStates + (extra._8_8_ & 0xffffffff),"A_Scream");
        if ((extra._32_8_ & 1) == 0) {
          if (extra.SpawnStart + 1 < extra.SpawnEnd) {
            FState::SetAction(pPVar4->OwnedStates + (extra.SpawnStart + 1),"A_NoBlocking");
          }
          else {
            FState::SetAction(pPVar4->OwnedStates + (extra._8_8_ & 0xffffffff),"A_ScreamAndUnblock")
            ;
          }
        }
        if (((double)extra._40_8_ == 0.0) && (!NAN((double)extra._40_8_))) {
          pBVar1 = (pPVar4->super_PClass).Defaults;
          extra.bSolidOnDeath = (bool)pBVar1[0x160];
          extra.bSolidOnBurn = (bool)pBVar1[0x161];
          extra.bBurnAway = (bool)pBVar1[0x162];
          extra.bDiesAway = (bool)pBVar1[0x163];
          extra.bGenericIceDeath = (bool)pBVar1[0x164];
          extra.bExplosive = (bool)pBVar1[0x165];
          extra._46_1_ = pBVar1[0x166];
          extra._47_1_ = pBVar1[0x167];
        }
        pPVar4->DeathHeight = (double)extra._40_8_;
      }
      FStateDefinitions::SetStateLabel
                ((FStateDefinitions *)&bag.Lumpnum,"Death",
                 pPVar4->OwnedStates + (extra._8_8_ & 0xffffffff),'\x01');
    }
    if (extra.IceDeathEnd != 0) {
      for (local_140 = extra._24_8_ & 0xffffffff; local_140 < extra.IceDeathEnd - 1;
          local_140 = local_140 + 1) {
        pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + local_140 + 1;
      }
      if ((extra._32_8_ & 0x10000) == 0) {
        pPVar4->OwnedStates[local_140].Tics = -1;
        pPVar4->OwnedStates[local_140].TicRange = 0;
        pPVar4->OwnedStates[local_140].Misc1 = 0;
      }
      else {
        pPVar4->OwnedStates[local_140].NextState = (FState *)0x0;
      }
      FState::SetAction(pPVar4->OwnedStates + (extra._24_8_ & 0xffffffff),"A_ActiveSound");
      if ((extra._32_8_ & 0x100) == 0) {
        if (extra.IceDeathStart + 1 < extra.IceDeathEnd) {
          FState::SetAction(pPVar4->OwnedStates + (extra.IceDeathStart + 1),"A_NoBlocking");
        }
        else {
          FState::SetAction(pPVar4->OwnedStates + (extra._24_8_ & 0xffffffff),"A_ActiveAndUnblock");
        }
      }
      if ((extra.DeathHeight == 0.0) && (!NAN(extra.DeathHeight))) {
        extra.DeathHeight = *(double *)((pPVar4->super_PClass).Defaults + 0x160);
      }
      pPVar4->BurnHeight = extra.DeathHeight;
      FStateDefinitions::SetStateLabel
                ((FStateDefinitions *)&bag.Lumpnum,"Burn",
                 pPVar4->OwnedStates + (extra._24_8_ & 0xffffffff),'\x01');
    }
    this = AActor::RegistrationInfo.MyClass;
    if (extra.DeathEnd == 0) {
      if ((extra._32_8_ & 0x100000000) != 0) {
        FName::FName(&local_144,NAME_GenericFreezeDeath);
        pFVar6 = PClassActor::FindState((PClassActor *)this,&local_144);
        FStateDefinitions::SetStateLabel((FStateDefinitions *)&bag.Lumpnum,"Ice",pFVar6,'\x01');
      }
    }
    else {
      for (local_140 = extra._16_8_ & 0xffffffff; local_140 < extra.DeathEnd - 1;
          local_140 = local_140 + 1) {
        pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + local_140 + 1;
      }
      pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + (pPVar4->NumOwnedStates + -1)
      ;
      pPVar4->OwnedStates[local_140].Tics = 5;
      pPVar4->OwnedStates[local_140].TicRange = 0;
      pPVar4->OwnedStates[local_140].Misc1 = 0;
      FState::SetAction(pPVar4->OwnedStates + local_140,"A_FreezeDeath");
      local_140 = (ulong)(pPVar4->NumOwnedStates + -1);
      pPVar4->OwnedStates[local_140].NextState = pPVar4->OwnedStates + local_140;
      pPVar4->OwnedStates[local_140].Tics = 1;
      pPVar4->OwnedStates[local_140].TicRange = 0;
      pPVar4->OwnedStates[local_140].Misc1 = 0;
      FState::SetAction(pPVar4->OwnedStates + local_140,"A_FreezeDeathChunks");
      FStateDefinitions::SetStateLabel
                ((FStateDefinitions *)&bag.Lumpnum,"Ice",
                 pPVar4->OwnedStates + (extra._16_8_ & 0xffffffff),'\x01');
    }
  }
  if (bag.ScriptPosition._12_4_ == 1) {
    TFlags<ActorFlag,_unsigned_int>::operator|=
              ((TFlags<ActorFlag,_unsigned_int> *)((pPVar4->super_PClass).Defaults + 0x18c),
               MF_SHOOTABLE);
  }
  if (bag.ScriptPosition._12_4_ == 3) {
    operator|((EnumType)&local_148,MF_DROPOFF);
    TFlags<ActorFlag,_unsigned_int>::operator|=
              ((TFlags<ActorFlag,_unsigned_int> *)((pPVar4->super_PClass).Defaults + 0x18c),
               &local_148);
  }
  FStateDefinitions::SetStateLabel
            ((FStateDefinitions *)&bag.Lumpnum,"Spawn",
             pPVar4->OwnedStates + (extra._0_8_ & 0xffffffff),'\x01');
  FStateDefinitions::InstallStates
            ((FStateDefinitions *)&bag.Lumpnum,pPVar4,(AActor *)(pPVar4->super_PClass).Defaults);
  TArray<FState,_FState>::~TArray((TArray<FState,_FState> *)local_98);
  Baggage::~Baggage((Baggage *)&StateArray.Most);
  return;
}

Assistant:

void ParseOldDecoration(FScanner &sc, EDefinitionType def)
{
	Baggage bag;
	TArray<FState> StateArray;
	FExtraInfo extra;
	PClassActor *type;
	PClassActor *parent;
	FName typeName;

	parent = (def == DEF_Pickup) ? RUNTIME_CLASS(AFakeInventory) : RUNTIME_CLASS(AActor);

	sc.MustGetString();
	typeName = FName(sc.String);
	type = static_cast<PClassActor *>(parent->CreateDerivedClass (typeName, parent->Size));
	ResetBaggage(&bag, parent);
	bag.Info = type;
#ifdef _DEBUG
	bag.ClassName = type->TypeName;
#endif

	type->GameFilter = GAME_Any;
	sc.MustGetStringName("{");

	memset (&extra, 0, sizeof(extra));
	ParseInsideDecoration (bag, (AActor *)(type->Defaults), extra, def, sc, StateArray);

	bag.Info->NumOwnedStates = StateArray.Size();
	if (bag.Info->NumOwnedStates == 0)
	{
		sc.ScriptError ("%s does not define any animation frames", typeName.GetChars() );
	}
	else if (extra.SpawnEnd == 0)
	{
		sc.ScriptError ("%s does not have a Frames definition", typeName.GetChars() );
	}
	else if (def == DEF_BreakableDecoration && extra.DeathEnd == 0)
	{
		sc.ScriptError ("%s does not have a DeathFrames definition", typeName.GetChars() );
	}
	else if (extra.IceDeathEnd != 0 && extra.bGenericIceDeath)
	{
		sc.ScriptError ("You cannot use IceDeathFrames and GenericIceDeath together");
	}

	if (extra.IceDeathEnd != 0)
	{
		// Make a copy of the final frozen frame for A_FreezeDeathChunks
		FState icecopy = StateArray[extra.IceDeathEnd-1];
		StateArray.Push (icecopy);
		type->NumOwnedStates += 1;
	}

	type->OwnedStates = new FState[type->NumOwnedStates];
	memcpy (type->OwnedStates, &StateArray[0], type->NumOwnedStates * sizeof(type->OwnedStates[0]));
	if (type->NumOwnedStates == 1)
	{
		type->OwnedStates->Tics = -1;
		type->OwnedStates->TicRange = 0;
		type->OwnedStates->Misc1 = 0;
	}
	else
	{
		size_t i;

		// Spawn states loop endlessly
		for (i = extra.SpawnStart; i < extra.SpawnEnd-1; ++i)
		{
			type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
		}
		type->OwnedStates[i].NextState = &type->OwnedStates[extra.SpawnStart];

		// Death states are one-shot and freeze on the final state
		if (extra.DeathEnd != 0)
		{
			for (i = extra.DeathStart; i < extra.DeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bDiesAway || def == DEF_Projectile)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			if (def == DEF_Projectile)
			{
				if (extra.bExplosive)
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_Explode");
				}
			}
			else
			{
				// The first frame plays the death sound and
				// the second frame makes it nonsolid.
				type->OwnedStates[extra.DeathStart].SetAction("A_Scream");
				if (extra.bSolidOnDeath)
				{
				}
				else if (extra.DeathStart + 1 < extra.DeathEnd)
				{
					type->OwnedStates[extra.DeathStart+1].SetAction("A_NoBlocking");
				}
				else
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_ScreamAndUnblock");
				}

				if (extra.DeathHeight == 0)
				{
					extra.DeathHeight = ((AActor*)(type->Defaults))->Height;
				}
				type->DeathHeight = extra.DeathHeight;
			}
			bag.statedef.SetStateLabel("Death", &type->OwnedStates[extra.DeathStart]);
		}

		// Burn states are the same as death states, except they can optionally terminate
		if (extra.FireDeathEnd != 0)
		{
			for (i = extra.FireDeathStart; i < extra.FireDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bBurnAway)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			// The first frame plays the burn sound and
			// the second frame makes it nonsolid.
			type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveSound");
			if (extra.bSolidOnBurn)
			{
			}
			else if (extra.FireDeathStart + 1 < extra.FireDeathEnd)
			{
				type->OwnedStates[extra.FireDeathStart+1].SetAction("A_NoBlocking");
			}
			else
			{
				type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveAndUnblock");
			}

			if (extra.BurnHeight == 0) extra.BurnHeight = ((AActor*)(type->Defaults))->Height;
			type->BurnHeight = extra.BurnHeight;

			bag.statedef.SetStateLabel("Burn", &type->OwnedStates[extra.FireDeathStart]);
		}

		// Ice states are similar to burn and death, except their final frame enters
		// a loop that eventually causes them to bust to pieces.
		if (extra.IceDeathEnd != 0)
		{
			for (i = extra.IceDeathStart; i < extra.IceDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			type->OwnedStates[i].NextState = &type->OwnedStates[type->NumOwnedStates-1];
			type->OwnedStates[i].Tics = 5;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeath");

			i = type->NumOwnedStates - 1;
			type->OwnedStates[i].NextState = &type->OwnedStates[i];
			type->OwnedStates[i].Tics = 1;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeathChunks");
			bag.statedef.SetStateLabel("Ice", &type->OwnedStates[extra.IceDeathStart]);
		}
		else if (extra.bGenericIceDeath)
		{
			bag.statedef.SetStateLabel("Ice", RUNTIME_CLASS(AActor)->FindState(NAME_GenericFreezeDeath));
		}
	}
	if (def == DEF_BreakableDecoration)
	{
		((AActor *)(type->Defaults))->flags |= MF_SHOOTABLE;
	}
	if (def == DEF_Projectile)
	{
		((AActor *)(type->Defaults))->flags |= MF_DROPOFF|MF_MISSILE;
	}
	bag.statedef.SetStateLabel("Spawn", &type->OwnedStates[extra.SpawnStart]);
	bag.statedef.InstallStates (type, ((AActor *)(type->Defaults)));
}